

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffd2f(double dval,int decim,char *cval,int *status)

{
  int iVar1;
  char *pcVar2;
  char *cptr;
  int *status_local;
  char *cval_local;
  int decim_local;
  double dval_local;
  
  if (*status < 1) {
    *cval = '\0';
    if (decim < 0) {
      ffpmsg("Error in ffd2f:  no. of decimal places < 0");
      *status = 0x19b;
      dval_local._4_4_ = 0x19b;
    }
    else {
      iVar1 = snprintf(cval,0x47,"%.*f",dval,(ulong)(uint)decim);
      if (iVar1 < 0) {
        ffpmsg("Error in ffd2f converting double to string");
        *status = 0x192;
      }
      pcVar2 = strchr(cval,0x2c);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '.';
      }
      pcVar2 = strchr(cval,0x4e);
      if (pcVar2 != (char *)0x0) {
        ffpmsg("Error in ffd2f: double value is a NaN or INDEF");
        *status = 0x192;
      }
      dval_local._4_4_ = *status;
    }
  }
  else {
    dval_local._4_4_ = *status;
  }
  return dval_local._4_4_;
}

Assistant:

int ffd2f(double dval,  /* I - value to be converted to a string */
          int decim,    /* I - number of decimal places to display */
          char *cval,   /* O - character string representation of the value */
          int *status)  /* IO - error status */
/*
  convert double value to a null-terminated F format string
*/
{
    char *cptr;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    cval[0] = '\0';

    if (decim < 0)
    {
        ffpmsg("Error in ffd2f:  no. of decimal places < 0");
        return(*status = BAD_DECIM);
    }

    if (snprintf(cval, FLEN_VALUE,"%.*f", decim, dval) < 0)
    {
        ffpmsg("Error in ffd2f converting double to string");
        *status = BAD_F2C;
    }

    /* replace comma with a period (e.g. in French locale) */
    if ( (cptr = strchr(cval, ','))) *cptr = '.';

    /* test if output string is 'NaN', 'INDEF', or 'INF' */
    if (strchr(cval, 'N'))
    {
        ffpmsg("Error in ffd2f: double value is a NaN or INDEF");
        *status = BAD_F2C;
    }

    return(*status);
}